

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_CECoordinates.cpp
# Opt level: O3

bool __thiscall test_CECoordinates::test_ConvertTo(test_CECoordinates *this)

{
  CECoordinates *this_00;
  undefined1 uVar1;
  double date_00;
  CECoordinates test_obs;
  CECoordinates test_gal;
  CECoordinates test_cirs;
  CEDate date;
  CECoordinates test_icrs;
  CEObserver observer;
  allocator local_1f5;
  undefined4 local_1f4;
  undefined4 local_1f0 [8];
  CECoordinates local_1d0;
  CECoordinates local_1a0;
  CECoordinates local_170;
  CEDate local_140;
  CECoordinates local_100;
  CEObserver local_d0;
  
  local_140._vptr_CEDate = (_func_int **)0x0;
  local_100._vptr_CECoordinates = (_func_int **)0x0;
  local_170._vptr_CECoordinates = (_func_int **)0x0;
  local_1a0._vptr_CECoordinates._0_4_ = 0;
  CEObserver::CEObserver
            (&local_d0,(double *)&local_140,(double *)&local_100,(double *)&local_170,
             (CEAngleType *)&local_1a0);
  local_140._vptr_CEDate = (_func_int **)0x0;
  CEObserver::SetTemperature_C(&local_d0,(double *)&local_140);
  local_140._vptr_CEDate = (_func_int **)0x0;
  CEObserver::SetPressure_hPa(&local_d0,(double *)&local_140);
  local_140._vptr_CEDate = (_func_int **)0x0;
  CEObserver::SetWavelength_um(&local_d0,(double *)&local_140);
  local_140._vptr_CEDate = (_func_int **)0x0;
  CEObserver::SetRelativeHumidity(&local_d0,(double *)&local_140);
  date_00 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_140,date_00,JD);
  this_00 = &this->base_icrs_;
  CECoordinates::ConvertTo(&local_100,this_00,ICRS,&local_d0,&local_140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_170,"test_ConvertTo",(allocator *)&local_1d0);
  local_1a0._vptr_CECoordinates._0_4_ = 0x24e;
  (**(code **)(*(long *)this + 200))(this,&local_100,this_00,&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1d0);
  CECoordinates::ConvertTo(&local_170,this_00,CIRS,&local_d0,&local_140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1a0,"test_ConvertTo",(allocator *)local_1f0);
  local_1d0._vptr_CECoordinates._0_4_ = 0x251;
  (**(code **)(*(long *)this + 200))(this,&local_170,&this->base_cirs_,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)local_1f0);
  CECoordinates::ConvertTo(&local_1a0,this_00,GALACTIC,&local_d0,&local_140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1d0,"test_ConvertTo",(allocator *)&local_1f4);
  local_1f0[0] = 0x254;
  (**(code **)(*(long *)this + 200))(this,&local_1a0,&this->base_gal_,&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1f4);
  CECoordinates::ConvertTo(&local_1d0,this_00,OBSERVED,&local_d0,&local_140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_1f0,"test_ConvertTo",&local_1f5);
  local_1f4 = 599;
  (**(code **)(*(long *)this + 200))(this,&local_1d0,&this->base_obs_,local_1f0);
  std::__cxx11::string::~string((string *)local_1f0);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_1f5);
  uVar1 = (**(code **)(*(long *)this + 0x18))(this);
  CECoordinates::~CECoordinates(&local_1d0);
  CECoordinates::~CECoordinates(&local_1a0);
  CECoordinates::~CECoordinates(&local_170);
  CECoordinates::~CECoordinates(&local_100);
  CEDate::~CEDate(&local_140);
  CEObserver::~CEObserver(&local_d0);
  return (bool)uVar1;
}

Assistant:

bool test_CECoordinates::test_ConvertTo(void)
{
    // Create an observer object
    CEObserver observer(0.0, 0.0, 0.0, CEAngleType::DEGREES);
    observer.SetTemperature_C(0.0);
    observer.SetPressure_hPa(0.0);
    observer.SetWavelength_um(0.0);
    observer.SetRelativeHumidity(0.0);

    // Create a date object
    CEDate date(CppEphem::julian_date_J2000(), CEDateType::JD);

    /* ---------------------------*
     * ConvertTo basic form
     * ---------------------------*/
    CECoordinates test_icrs = base_icrs_.ConvertTo(CECoordinateType::ICRS,
                                                   observer, date);
    test_coords(test_icrs, base_icrs_, __func__, __LINE__);
    CECoordinates test_cirs = base_icrs_.ConvertTo(CECoordinateType::CIRS,
                                                   observer, date);
    test_coords(test_cirs, base_cirs_, __func__, __LINE__);
    CECoordinates test_gal = base_icrs_.ConvertTo(CECoordinateType::GALACTIC,
                                                  observer, date);
    test_coords(test_gal, base_gal_, __func__, __LINE__);
    CECoordinates test_obs = base_icrs_.ConvertTo(CECoordinateType::OBSERVED,
                                                  observer, date);
    test_coords(test_obs, base_obs_, __func__, __LINE__);

    return pass();
}